

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O3

int MPIABI_Waitall(int count,MPIABI_Request *array_of_requests,MPIABI_Status *array_of_statuses)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  anon_union_24_2_44bf1552_for_mpi_status *paVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined8 *puVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  anon_union_24_2_44bf1552_for_mpi_status *paVar13;
  ulong uVar14;
  
  if (array_of_statuses == (MPIABI_Status *)0x0) {
    array_of_statuses = (MPIABI_Status *)0x0;
  }
  else if (0 < count) {
    uVar14 = (ulong)(uint)count;
    puVar9 = (undefined8 *)((long)&array_of_statuses->mpi_status + 0xc);
    lVar11 = 0;
    do {
      uVar1 = *(undefined4 *)((long)&array_of_statuses->mpi_status + lVar11 + 0x14);
      uVar4 = *(undefined8 *)((long)&array_of_statuses->mpi_status + lVar11 + 0xc);
      uVar2 = *(undefined4 *)((long)&array_of_statuses->MPI_ERROR + lVar11);
      *(undefined8 *)((long)puVar9 + -0xc) =
           *(undefined8 *)((long)&array_of_statuses->MPI_SOURCE + lVar11);
      *(undefined4 *)((long)puVar9 + -4) = uVar2;
      *puVar9 = uVar4;
      *(undefined4 *)(puVar9 + 1) = uVar1;
      puVar9 = puVar9 + 3;
      lVar11 = lVar11 + 0x28;
    } while (uVar14 * 0x28 != lVar11);
    iVar8 = MPI_Waitall(count,array_of_requests,array_of_statuses);
    if (0 < count) {
      uVar10 = uVar14 + 1;
      piVar12 = &array_of_statuses[uVar14 - 1].MPI_ERROR;
      paVar5 = &array_of_statuses->mpi_status + uVar14;
      do {
        paVar13 = paVar5 + -1;
        iVar3 = *(int *)((long)paVar5 + -0x10);
        uVar4 = *(undefined8 *)paVar13;
        uVar6 = *(undefined8 *)paVar13;
        uVar7 = *(undefined8 *)((long)paVar5 + -0x10);
        *(undefined8 *)(piVar12 + -4) = *(undefined8 *)((long)paVar5 + -8);
        *(undefined8 *)&((MPIABI_Status *)(piVar12 + -8))->mpi_status = uVar6;
        *(undefined8 *)(piVar12 + -6) = uVar7;
        *(undefined8 *)(piVar12 + -2) = uVar4;
        *piVar12 = iVar3;
        uVar10 = uVar10 - 1;
        piVar12 = piVar12 + -10;
        paVar5 = paVar13;
      } while (1 < uVar10);
    }
    return iVar8;
  }
  iVar8 = MPI_Waitall(count,array_of_requests,array_of_statuses);
  return iVar8;
}

Assistant:

int MPIABI_Waitall(int count, MPIABI_Request array_of_requests[],
                              MPIABI_Status array_of_statuses[]) {
  const bool ignore_statuses =
      (MPI_Status *)array_of_statuses == MPI_STATUSES_IGNORE;
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < count; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  MPI_Status *const stats = (MPI_Status *)(void *)array_of_statuses;
  if (!ignore_statuses)
    for (int i = 0; i < count; ++i)
      stats[i] = (WPI_Status)array_of_statuses[i];
  const int ierr = MPI_Waitall(count, reqs, stats);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = count - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  if (!ignore_statuses)
    for (int i = count - 1; i >= 0; --i)
      array_of_statuses[i] = (WPI_Status)stats[i];
  return ierr;
}